

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O2

void DrawCircleGradient(int centerX,int centerY,float radius,Color color1,Color color2)

{
  uint uVar1;
  float x;
  float y;
  float fVar2;
  float fVar3;
  undefined1 local_40;
  
  rlCheckRenderBatchLimit(0x6c);
  rlBegin(4);
  x = (float)centerX;
  y = (float)centerY;
  uVar1 = 0;
  local_40 = color1.a;
  while (uVar1 < 0x168) {
    rlColor4ub(color1.r,color1.g,color1.b,local_40);
    rlVertex2f(x,y);
    rlColor4ub(color2.r,color2.g,color2.b,color2.a);
    fVar2 = sinf((float)(int)uVar1 * 0.017453292);
    fVar3 = cosf((float)(int)uVar1 * 0.017453292);
    rlVertex2f(fVar2 * radius + x,fVar3 * radius + y);
    rlColor4ub(color2.r,color2.g,color2.b,color2.a);
    uVar1 = uVar1 + 10;
    fVar2 = sinf((float)(int)uVar1 * 0.017453292);
    fVar3 = cosf((float)(int)uVar1 * 0.017453292);
    rlVertex2f(fVar2 * radius + x,fVar3 * radius + y);
  }
  rlEnd();
  return;
}

Assistant:

void DrawCircleGradient(int centerX, int centerY, float radius, Color color1, Color color2)
{
    rlCheckRenderBatchLimit(3*36);

    rlBegin(RL_TRIANGLES);
        for (int i = 0; i < 360; i += 10)
        {
            rlColor4ub(color1.r, color1.g, color1.b, color1.a);
            rlVertex2f((float)centerX, (float)centerY);
            rlColor4ub(color2.r, color2.g, color2.b, color2.a);
            rlVertex2f((float)centerX + sinf(DEG2RAD*i)*radius, (float)centerY + cosf(DEG2RAD*i)*radius);
            rlColor4ub(color2.r, color2.g, color2.b, color2.a);
            rlVertex2f((float)centerX + sinf(DEG2RAD*(i + 10))*radius, (float)centerY + cosf(DEG2RAD*(i + 10))*radius);
        }
    rlEnd();
}